

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O2

UNormalizationCheckResult unorm_getQuickCheck_63(UChar32 c,UNormalizationMode mode)

{
  UNormalizationCheckResult UVar1;
  Normalizer2 *pNVar2;
  ulong uStack_18;
  UErrorCode errorCode;
  
  if (mode - UNORM_FCD < 0xfffffffc) {
    return UNORM_YES;
  }
  uStack_18 = (ulong)(mode - UNORM_FCD);
  pNVar2 = icu_63::Normalizer2Factory::getInstance(mode,&errorCode);
  if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar1 = (*(pNVar2->super_UObject)._vptr_UObject[0x15])(pNVar2,c);
  }
  else {
    UVar1 = UNORM_MAYBE;
  }
  return UVar1;
}

Assistant:

U_CFUNC UNormalizationCheckResult
unorm_getQuickCheck(UChar32 c, UNormalizationMode mode) {
    if(mode<=UNORM_NONE || UNORM_FCD<=mode) {
        return UNORM_YES;
    }
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2 *norm2=Normalizer2Factory::getInstance(mode, errorCode);
    if(U_SUCCESS(errorCode)) {
        return ((const Normalizer2WithImpl *)norm2)->getQuickCheck(c);
    } else {
        return UNORM_MAYBE;
    }
}